

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ppu.c
# Opt level: O0

void render_line_mode4(gba_ppu_t *ppu)

{
  ushort uVar1;
  int iVar2;
  bool bVar3;
  ushort uVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  gba_ppu_t *in_RDI;
  bool bVar8;
  int x_1;
  int tile;
  int index;
  int offset;
  int x;
  uint16_t *warr_2;
  uint16_t *warr_1;
  uint16_t *warr;
  uint8_t obj_blend_mode;
  gba_color_t pixel;
  _Bool force_obj_std_blend;
  _Bool should_blend_obj;
  _Bool should_blend;
  _Bool should_blend_multiple;
  _Bool overlaps_target_pixel;
  _Bool should_blend_single;
  _Bool should_draw;
  int bg;
  int i;
  _Bool winout_display;
  _Bool winobj_display;
  _Bool win1_display;
  _Bool win0_display;
  _Bool winout;
  _Bool win1;
  _Bool win0;
  _Bool should_blend_window;
  gba_color_t draw;
  int last_layer_drawn;
  gba_color_t last;
  int x_2;
  _Bool bg_bottom [6];
  _Bool bg_top [6];
  _Bool bg_enabled [4];
  uint8_t ey;
  uint8_t evb;
  uint8_t eva;
  uint16_t *warr_3;
  uint32_t new_b;
  uint32_t new_g;
  uint32_t new_r;
  gba_color_t blended;
  uint32_t new_b_1;
  uint32_t new_g_1;
  uint32_t new_r_1;
  gba_color_t blended_1;
  uint32_t new_b_2;
  uint32_t new_g_2;
  uint32_t new_r_2;
  gba_color_t blended_2;
  uint32_t new_b_3;
  uint32_t new_g_3;
  uint32_t new_r_3;
  gba_color_t blended_3;
  uint32_t new_b_4;
  uint32_t new_g_4;
  uint32_t new_r_4;
  gba_color_t blended_4;
  uint32_t new_b_5;
  uint32_t new_g_5;
  uint32_t new_r_5;
  gba_color_t blended_5;
  undefined1 in_stack_fffffffffffffd78;
  undefined1 in_stack_fffffffffffffd79;
  undefined1 in_stack_fffffffffffffd7a;
  undefined1 in_stack_fffffffffffffd7b;
  undefined1 in_stack_fffffffffffffd7c;
  bool bVar9;
  undefined1 in_stack_fffffffffffffd7d;
  undefined1 in_stack_fffffffffffffd7e;
  undefined1 in_stack_fffffffffffffd7f;
  uint local_280;
  uint local_27c;
  uint local_278;
  int local_274;
  int local_264;
  byte local_1f5;
  uint local_1f0;
  byte local_1e3;
  ushort local_1e2;
  int local_1e0;
  ushort local_1da;
  int local_1d8;
  byte local_1d3 [4];
  byte local_1cf;
  byte local_1ce;
  byte local_1cd [4];
  byte local_1c9;
  byte local_1c8;
  byte local_1c7 [4];
  char local_1c3;
  undefined1 local_1c2;
  undefined1 local_1c1;
  uint8_t *local_1b8;
  undefined4 local_1ac;
  uint8_t *local_1a8;
  uint local_1a0;
  int local_19c;
  uint local_190;
  int local_18c;
  uint local_180;
  uint local_17c;
  uint local_178;
  uint local_174;
  uint local_170;
  int local_16c;
  uint local_168;
  uint local_164;
  uint local_160;
  uint local_15c;
  uint local_158;
  int local_154;
  uint local_150;
  uint local_14c;
  uint local_148;
  undefined1 local_144;
  undefined1 local_143;
  ushort local_142;
  ushort local_140;
  ushort local_13e;
  uint local_13c;
  uint local_138;
  uint local_134;
  byte local_130;
  char local_12f;
  ushort local_12e;
  gba_color_t local_12c;
  ushort local_12a;
  uint local_128;
  uint local_124;
  uint local_120;
  byte local_11c;
  char local_11b;
  ushort local_11a;
  gba_color_t local_118;
  ushort local_116;
  uint local_114;
  uint local_110;
  uint local_10c;
  undefined1 local_108;
  undefined1 local_107;
  ushort local_106;
  ushort local_104;
  ushort local_102;
  uint local_100;
  uint local_fc;
  uint local_f8;
  byte local_f4;
  char local_f3;
  ushort local_f2;
  gba_color_t local_f0;
  ushort local_ee;
  uint local_ec;
  uint local_e8;
  uint local_e4;
  byte local_e0;
  char local_df;
  ushort local_de;
  gba_color_t local_dc;
  ushort local_da;
  uint local_d8;
  undefined4 local_d4;
  uint local_d0;
  uint local_cc;
  undefined4 local_c8;
  uint local_c4;
  uint local_c0;
  undefined4 local_bc;
  uint local_b8;
  uint local_b4;
  undefined4 local_b0;
  uint local_ac;
  uint local_a8;
  undefined4 local_a4;
  uint local_a0;
  uint local_9c;
  undefined4 local_98;
  uint local_94;
  uint local_90;
  undefined4 local_8c;
  uint local_88;
  uint local_84;
  undefined4 local_80;
  uint local_7c;
  uint local_78;
  undefined4 local_74;
  uint local_70;
  uint local_6c;
  undefined4 local_68;
  uint local_64;
  uint local_60;
  undefined4 local_5c;
  uint local_58;
  uint local_54;
  undefined4 local_50;
  uint local_4c;
  uint local_48;
  undefined4 local_44;
  uint local_40;
  uint local_3c;
  undefined4 local_38;
  uint local_34;
  uint local_30;
  undefined4 local_2c;
  uint local_28;
  uint local_24;
  undefined4 local_20;
  uint local_1c;
  uint local_18;
  undefined4 local_14;
  uint local_10;
  uint local_c;
  undefined4 local_8;
  uint local_4;
  
  if (((in_RDI->DISPCNT).raw >> 0xc & 1) != 0) {
    render_obj((gba_ppu_t *)
               CONCAT17(in_stack_fffffffffffffd7f,
                        CONCAT16(in_stack_fffffffffffffd7e,
                                 CONCAT15(in_stack_fffffffffffffd7d,
                                          CONCAT14(in_stack_fffffffffffffd7c,
                                                   CONCAT13(in_stack_fffffffffffffd7b,
                                                            CONCAT12(in_stack_fffffffffffffd7a,
                                                                     CONCAT11(
                                                  in_stack_fffffffffffffd79,
                                                  in_stack_fffffffffffffd78))))))));
  }
  if (((in_RDI->DISPCNT).raw >> 10 & 1) == 0) {
    for (local_274 = 0; local_274 < 0xf0; local_274 = local_274 + 1) {
      in_RDI->bgbuf[2][local_274] = *(gba_color_t *)in_RDI->pram;
      in_RDI->bgbuf[2][local_274].raw = in_RDI->bgbuf[2][local_274].raw & 0x7fff | 0x8000;
    }
  }
  else {
    for (local_264 = 0; local_264 < 0xf0; local_264 = local_264 + 1) {
      if (in_RDI->vram
          [(int)((uint)((byte)((in_RDI->DISPCNT).raw >> 4) & 1) * 0xa000 +
                local_264 + (uint)in_RDI->y * 0xf0)] == 0) {
        in_RDI->bgbuf[2][local_264] = *(gba_color_t *)in_RDI->pram;
        in_RDI->bgbuf[2][local_264].raw = in_RDI->bgbuf[2][local_264].raw & 0x7fff | 0x8000;
      }
      else {
        in_RDI->bgbuf[2][local_264].raw =
             *(ushort *)
              (in_RDI->pram +
              (int)((uint)in_RDI->vram
                          [(int)((uint)((byte)((in_RDI->DISPCNT).raw >> 4) & 1) * 0xa000 +
                                local_264 + (uint)in_RDI->y * 0xf0)] << 1)) & 0x7fff;
        in_RDI->bgbuf[2][local_264].raw = in_RDI->bgbuf[2][local_264].raw & 0x7fff;
      }
    }
  }
  dbg_line_drawn();
  refresh_background_priorities(in_RDI);
  if (((in_RDI->BLDALPHA).raw & 0x1f) < 0x10) {
    local_278 = (uint)((in_RDI->BLDALPHA).raw & 0x1f);
  }
  else {
    local_278 = 0x10;
  }
  local_1c1 = (undefined1)local_278;
  if (((in_RDI->BLDALPHA).raw >> 8 & 0x1f) < 0x10) {
    local_27c = (uint)((in_RDI->BLDALPHA).raw >> 8 & 0x1f);
  }
  else {
    local_27c = 0x10;
  }
  local_1c2 = (undefined1)local_27c;
  if (((in_RDI->BLDY).raw & 0x1f) < 0x10) {
    local_280 = (uint)((in_RDI->BLDY).raw & 0x1f);
  }
  else {
    local_280 = 0x10;
  }
  local_1c3 = (char)local_280;
  local_1c7[0] = (byte)((in_RDI->DISPCNT).raw >> 8) & 1;
  local_1c7[1] = (byte)((in_RDI->DISPCNT).raw >> 9) & 1;
  local_1c7[2] = (byte)((in_RDI->DISPCNT).raw >> 10) & 1;
  local_1c7[3] = (byte)((in_RDI->DISPCNT).raw >> 0xb) & 1;
  local_1cd[0] = (byte)(in_RDI->BLDCNT).raw & 1;
  local_1cd[1] = (byte)((in_RDI->BLDCNT).raw >> 1) & 1;
  local_1cd[2] = (byte)((in_RDI->BLDCNT).raw >> 2) & 1;
  local_1cd[3] = (byte)((in_RDI->BLDCNT).raw >> 3) & 1;
  local_1c9 = (byte)((in_RDI->BLDCNT).raw >> 4) & 1;
  local_1c8 = (byte)((in_RDI->BLDCNT).raw >> 5) & 1;
  local_1d3[0] = (byte)((in_RDI->BLDCNT).raw >> 8) & 1;
  local_1d3[1] = (byte)((in_RDI->BLDCNT).raw >> 9) & 1;
  local_1d3[2] = (byte)((in_RDI->BLDCNT).raw >> 10) & 1;
  local_1d3[3] = (byte)((in_RDI->BLDCNT).raw >> 0xb) & 1;
  local_1cf = (byte)((in_RDI->BLDCNT).raw >> 0xc) & 1;
  local_1ce = (byte)((in_RDI->BLDCNT).raw >> 0xd) & 1;
  for (local_1d8 = 0; local_1d8 < 0xf0; local_1d8 = local_1d8 + 1) {
    local_1a8 = in_RDI->pram;
    local_1ac = 0;
    local_1b8 = local_1a8;
    local_1e2 = *(ushort *)local_1a8;
    local_1e0 = 5;
    local_1e3 = 1;
    local_19c = local_1d8;
    local_1a0 = (uint)in_RDI->y;
    local_154 = local_1d8;
    local_158 = local_1a0;
    local_15c = (uint)((in_RDI->WIN0H).raw >> 8);
    local_160 = (uint)((in_RDI->WIN0H).raw & 0xff);
    local_164 = (uint)((in_RDI->WIN0V).raw >> 8);
    local_168 = (uint)((in_RDI->WIN0V).raw & 0xff);
    bVar8 = false;
    if (((int)local_15c <= local_1d8) && (bVar8 = false, local_1d8 <= (int)local_160)) {
      bVar8 = local_164 <= local_1a0 && local_1a0 <= local_168;
    }
    local_18c = local_1d8;
    local_190 = (uint)in_RDI->y;
    local_16c = local_1d8;
    local_170 = local_190;
    local_174 = (uint)((in_RDI->WIN1H).raw >> 8);
    local_178 = (uint)((in_RDI->WIN1H).raw & 0xff);
    local_17c = (uint)((in_RDI->WIN1V).raw >> 8);
    local_180 = (uint)((in_RDI->WIN1V).raw & 0xff);
    bVar9 = false;
    if (((int)local_174 <= local_1d8) && (bVar9 = false, local_1d8 <= (int)local_178)) {
      bVar9 = local_17c <= local_190 && local_190 <= local_180;
    }
    bVar3 = true;
    if (!bVar8) {
      bVar3 = bVar9;
    }
    bVar5 = (byte)((in_RDI->DISPCNT).raw >> 0xd) & 1;
    bVar6 = (byte)((in_RDI->DISPCNT).raw >> 0xe) & 1;
    bVar7 = 1;
    if (bVar5 == 0) {
      bVar7 = bVar6;
    }
    if ((bVar8) && (bVar5 != 0)) {
      local_1e3 = (byte)((in_RDI->WININ).raw >> 5) & 1;
    }
    else if ((bVar9) && (bVar6 != 0)) {
      local_1e3 = (byte)((in_RDI->WININ).raw >> 0xd) & 1;
    }
    else if (((in_RDI->obj_window[local_1d8] & 1U) == 0) || (-1 < (short)(in_RDI->DISPCNT).raw)) {
      if ((!bVar3) && (bVar7 != 0)) {
        local_1e3 = (byte)((in_RDI->WINOUT).raw >> 5) & 1;
      }
    }
    else {
      local_1e3 = (byte)((in_RDI->WINOUT).raw >> 0xd) & 1;
    }
    local_1da = local_1e2;
    for (local_1f0 = 3; -1 < (int)local_1f0; local_1f0 = local_1f0 - 1) {
      iVar2 = background_priorities[(int)local_1f0];
      local_1f5 = local_1c7[iVar2] & 1;
      bVar8 = true;
      if (((in_RDI->BLDCNT).raw >> 6 & 3) != 3) {
        bVar8 = ((in_RDI->BLDCNT).raw >> 6 & 3) == 2;
      }
      bVar5 = local_1d3[local_1e0] & 1;
      bVar7 = 0;
      if (((in_RDI->BLDCNT).raw >> 6 & 3) == 1) {
        bVar7 = bVar5;
      }
      bVar9 = false;
      if (((local_1e3 != 0) && (bVar9 = false, (local_1cd[iVar2] & 1) != 0)) &&
         (bVar9 = true, bVar7 == 0)) {
        bVar9 = bVar8;
      }
      bVar3 = false;
      if (((in_RDI->obj_alpha[local_1d8] & 1U) != 0) && (bVar3 = true, bVar5 == 0)) {
        bVar3 = bVar8;
      }
      uVar1 = in_RDI->bgbuf[iVar2][local_1d8].raw;
      if ((short)uVar1 < 0) {
        local_1f5 = 0;
      }
      uVar4 = uVar1;
      if (((local_1f5 == 0) || (!bVar9)) || ((short)uVar1 < 0)) {
        uVar4 = local_1da;
        if (local_1f5 != 0) {
          local_1e2 = uVar1;
          local_1e0 = iVar2;
          uVar4 = uVar1;
        }
      }
      else {
        local_1e0 = iVar2;
        switch((in_RDI->BLDCNT).raw >> 6 & 3) {
        case 0:
          fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                  "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                  ,0x229);
          fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m");
          exit(1);
        case 1:
          local_140 = local_1da;
          local_142 = uVar1;
          local_143 = local_1c2;
          local_144 = local_1c1;
          local_148 = (local_1da & 0x1f) * local_27c + (uVar1 & 0x1f) * local_278;
          local_14c = (local_1da >> 5 & 0x1f) * local_27c + (uVar1 >> 5 & 0x1f) * local_278;
          local_150 = (local_1da >> 10 & 0x1f) * local_27c + (uVar1 >> 10 & 0x1f) * local_278;
          local_c = local_148 >> 4;
          local_8 = 0x1f;
          if (local_c < 0x20) {
            local_4 = local_c;
          }
          else {
            local_4 = 0x1f;
          }
          local_18 = local_14c >> 4;
          local_14 = 0x1f;
          if (local_18 < 0x20) {
            local_10 = local_18;
          }
          else {
            local_10 = 0x1f;
          }
          local_24 = local_150 >> 4;
          local_20 = 0x1f;
          if (local_24 < 0x20) {
            local_1c = local_24;
          }
          else {
            local_1c = 0x1f;
          }
          local_1e2 = local_13e & 0x8000 | (ushort)local_4 & 0x1f | ((ushort)local_10 & 0x1f) << 5 |
                      ((ushort)local_1c & 0x1f) << 10;
          local_13e = local_1e2;
          break;
        case 2:
          local_130 = 0x10 - local_1c3;
          local_12c = white;
          local_12e = uVar1;
          local_12f = local_1c3;
          local_134 = (white.raw & 0x1f) * local_280 + (uint)(uVar1 & 0x1f) * (uint)local_130;
          local_138 = (white.raw >> 5 & 0x1f) * local_280 +
                      (uint)(uVar1 >> 5 & 0x1f) * (uint)local_130;
          local_13c = (white.raw >> 10 & 0x1f) * local_280 +
                      (uint)(uVar1 >> 10 & 0x1f) * (uint)local_130;
          local_30 = local_134 >> 4;
          local_2c = 0x1f;
          if (local_30 < 0x20) {
            local_28 = local_30;
          }
          else {
            local_28 = 0x1f;
          }
          local_3c = local_138 >> 4;
          local_38 = 0x1f;
          if (local_3c < 0x20) {
            local_34 = local_3c;
          }
          else {
            local_34 = 0x1f;
          }
          local_48 = local_13c >> 4;
          local_44 = 0x1f;
          if (local_48 < 0x20) {
            local_40 = local_48;
          }
          else {
            local_40 = 0x1f;
          }
          local_1e2 = local_12a & 0x8000 | (ushort)local_28 & 0x1f | ((ushort)local_34 & 0x1f) << 5
                      | ((ushort)local_40 & 0x1f) << 10;
          local_12a = local_1e2;
          break;
        case 3:
          local_11c = 0x10 - local_1c3;
          local_118 = black;
          local_11a = uVar1;
          local_11b = local_1c3;
          local_120 = (black.raw & 0x1f) * local_280 + (uint)(uVar1 & 0x1f) * (uint)local_11c;
          local_124 = (black.raw >> 5 & 0x1f) * local_280 +
                      (uint)(uVar1 >> 5 & 0x1f) * (uint)local_11c;
          local_128 = (black.raw >> 10 & 0x1f) * local_280 +
                      (uint)(uVar1 >> 10 & 0x1f) * (uint)local_11c;
          local_54 = local_120 >> 4;
          local_50 = 0x1f;
          if (local_54 < 0x20) {
            local_4c = local_54;
          }
          else {
            local_4c = 0x1f;
          }
          local_60 = local_124 >> 4;
          local_5c = 0x1f;
          if (local_60 < 0x20) {
            local_58 = local_60;
          }
          else {
            local_58 = 0x1f;
          }
          local_6c = local_128 >> 4;
          local_68 = 0x1f;
          if (local_6c < 0x20) {
            local_64 = local_6c;
          }
          else {
            local_64 = 0x1f;
          }
          local_1e2 = local_116 & 0x8000 | (ushort)local_4c & 0x1f | ((ushort)local_58 & 0x1f) << 5
                      | ((ushort)local_64 & 0x1f) << 10;
          local_116 = local_1e2;
        }
      }
      local_1da = uVar4;
      if ((in_RDI->obj_priorities[local_1d8] == local_1f0) &&
         (-1 < (short)in_RDI->objbuf[local_1d8].raw)) {
        uVar1 = in_RDI->objbuf[local_1d8].raw;
        uVar4 = uVar1;
        if (bVar3) {
          if (bVar5 == 0) {
            bVar7 = (byte)((in_RDI->BLDCNT).raw >> 6) & 3;
          }
          else {
            bVar7 = 1;
          }
          uVar4 = local_1e2;
          switch(bVar7) {
          case 0:
            fprintf(_stderr,"\x1b[0;31m[FATAL] at %s:%d ",
                    "/workspace/llm4binary/github/license_c_cmakelists/Dillonb[P]gba/src/graphics/ppu.c"
                    ,0x246);
            fprintf(_stderr,"Determined we should blend even though blending was off?\n\x1b[0;m");
            exit(1);
          case 1:
            local_104 = local_1da;
            local_106 = uVar1;
            local_107 = local_1c2;
            local_108 = local_1c1;
            local_10c = (local_1da & 0x1f) * local_27c + (uVar1 & 0x1f) * local_278;
            local_110 = (local_1da >> 5 & 0x1f) * local_27c + (uVar1 >> 5 & 0x1f) * local_278;
            local_114 = (local_1da >> 10 & 0x1f) * local_27c + (uVar1 >> 10 & 0x1f) * local_278;
            local_78 = local_10c >> 4;
            local_74 = 0x1f;
            if (local_78 < 0x20) {
              local_70 = local_78;
            }
            else {
              local_70 = 0x1f;
            }
            local_84 = local_110 >> 4;
            local_80 = 0x1f;
            if (local_84 < 0x20) {
              local_7c = local_84;
            }
            else {
              local_7c = 0x1f;
            }
            local_90 = local_114 >> 4;
            local_8c = 0x1f;
            if (local_90 < 0x20) {
              local_88 = local_90;
            }
            else {
              local_88 = 0x1f;
            }
            local_102 = local_102 & 0x8000 | (ushort)local_70 & 0x1f |
                        ((ushort)local_7c & 0x1f) << 5 | ((ushort)local_88 & 0x1f) << 10;
            uVar4 = local_102;
            break;
          case 2:
            local_f4 = 0x10 - local_1c3;
            local_f0 = white;
            local_f2 = uVar1;
            local_f3 = local_1c3;
            local_f8 = (white.raw & 0x1f) * local_280 + (uint)(uVar1 & 0x1f) * (uint)local_f4;
            local_fc = (white.raw >> 5 & 0x1f) * local_280 +
                       (uint)(uVar1 >> 5 & 0x1f) * (uint)local_f4;
            local_100 = (white.raw >> 10 & 0x1f) * local_280 +
                        (uint)(uVar1 >> 10 & 0x1f) * (uint)local_f4;
            local_9c = local_f8 >> 4;
            local_98 = 0x1f;
            if (local_9c < 0x20) {
              local_94 = local_9c;
            }
            else {
              local_94 = 0x1f;
            }
            local_a8 = local_fc >> 4;
            local_a4 = 0x1f;
            if (local_a8 < 0x20) {
              local_a0 = local_a8;
            }
            else {
              local_a0 = 0x1f;
            }
            local_b4 = local_100 >> 4;
            local_b0 = 0x1f;
            if (local_b4 < 0x20) {
              local_ac = local_b4;
            }
            else {
              local_ac = 0x1f;
            }
            local_ee = local_ee & 0x8000 | (ushort)local_94 & 0x1f | ((ushort)local_a0 & 0x1f) << 5
                       | ((ushort)local_ac & 0x1f) << 10;
            uVar4 = local_ee;
            break;
          case 3:
            local_e0 = 0x10 - local_1c3;
            local_dc = black;
            local_de = uVar1;
            local_df = local_1c3;
            local_e4 = (black.raw & 0x1f) * local_280 + (uint)(uVar1 & 0x1f) * (uint)local_e0;
            local_e8 = (black.raw >> 5 & 0x1f) * local_280 +
                       (uint)(uVar1 >> 5 & 0x1f) * (uint)local_e0;
            local_ec = (black.raw >> 10 & 0x1f) * local_280 +
                       (uint)(uVar1 >> 10 & 0x1f) * (uint)local_e0;
            local_c0 = local_e4 >> 4;
            local_bc = 0x1f;
            if (local_c0 < 0x20) {
              local_b8 = local_c0;
            }
            else {
              local_b8 = 0x1f;
            }
            local_cc = local_e8 >> 4;
            local_c8 = 0x1f;
            if (local_cc < 0x20) {
              local_c4 = local_cc;
            }
            else {
              local_c4 = 0x1f;
            }
            local_d8 = local_ec >> 4;
            local_d4 = 0x1f;
            if (local_d8 < 0x20) {
              local_d0 = local_d8;
            }
            else {
              local_d0 = 0x1f;
            }
            local_da = local_da & 0x8000 | (ushort)local_b8 & 0x1f | ((ushort)local_c4 & 0x1f) << 5
                       | ((ushort)local_d0 & 0x1f) << 10;
            uVar4 = local_da;
          }
        }
        local_1e2 = uVar4;
        local_1e0 = 4;
        local_1da = uVar1;
      }
    }
    in_RDI->screen[in_RDI->y][local_1d8].a = 0xff;
    in_RDI->screen[in_RDI->y][local_1d8].r = (byte)local_1e2 << 3 | (byte)local_1e2 & 7;
    in_RDI->screen[in_RDI->y][local_1d8].g =
         (char)(local_1e2 >> 5) << 3 | (byte)(local_1e2 >> 5) & 7;
    bVar7 = (byte)(local_1e2 >> 8);
    in_RDI->screen[in_RDI->y][local_1d8].b = (bVar7 >> 2) << 3 | bVar7 >> 2 & 7;
  }
  return;
}

Assistant:

void render_line_mode4(gba_ppu_t* ppu) {
    if (ppu->DISPCNT.screen_display_obj) {
        render_obj(ppu);
    }
    if (ppu->DISPCNT.screen_display_bg2) {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            int offset = x + (ppu->y * GBA_SCREEN_X);
            int index = ppu->DISPCNT.display_frame_select * 0xA000 + offset;
            int tile = ppu->vram[index];
            if (tile == 0) {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
                ppu->bgbuf[2][x].transparent = true;
            } else {
                ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, (0x20 * PALETTE_BANK_BACKGROUND + 2 * tile)) & 0x7FFF;
                ppu->bgbuf[2][x].transparent = false;
            }
        }
    } else {
        for (int x = 0; x < GBA_SCREEN_X; x++) {
            ppu->bgbuf[2][x].raw = half_from_byte_array(ppu->pram, 0);
            ppu->bgbuf[2][x].transparent = true;
        }
    }

    dbg_line_drawn();
    refresh_background_priorities(ppu);
    merge_bgs(ppu);
}